

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error po<48,49>(context *ctx,token *token,opcode *op)

{
  int iVar1;
  opcode *in_RCX;
  token local_50;
  opcode *local_28;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  local_28 = in_RCX;
  op_local = op;
  token_local = token;
  ctx_local = ctx;
  iVar1 = equal((token *)op,".PO");
  if (iVar1 == 0) {
    memset(ctx,0,8);
    error::error((error *)ctx);
  }
  else {
    opcode::add_bits(local_28,0x3000000000000);
    context::tokenize(&local_50,(context *)token_local);
    memcpy(op_local,&local_50,0x24);
    memset(ctx,0,8);
    error::error((error *)ctx);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(po)
{
    if (!equal(token, ".PO")) {
        return {};
    }
    op.add_bits((1ULL << address1) | (1ULL << address2));
    token = ctx.tokenize();
    return {};
}